

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,size_t pos,
          StringPtr *params)

{
  uint uVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  void *__s2;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  size_t sVar11;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar12;
  HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *this_00;
  ulong targetSize;
  undefined8 *in_R9;
  ulong uVar13;
  ArrayPtr<const_unsigned_char> s_00;
  Maybe<unsigned_long> MVar14;
  
  this_00 = (HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *)table.ptr;
  uVar13 = (this_00->buckets).size_ * 2;
  if (uVar13 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar13) {
      targetSize = uVar13;
    }
    HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>::rehash(this_00,targetSize);
  }
  s_00.size_ = in_R9[1] - 1;
  s_00.ptr = (uchar *)*in_R9;
  uVar6 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s_00);
  uVar7 = kj::_::chooseBucket((uint)(uVar6 != 0),(uint)(this_00->buckets).size_);
  pHVar2 = (this_00->buckets).ptr;
  sVar3 = (this_00->buckets).size_;
  __s2 = (void *)*in_R9;
  lVar4 = in_R9[1];
  paVar12 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar2 + uVar7);
    uVar1 = *(uint *)((long)paVar9 + 4);
    if (uVar1 == 1) {
      if (paVar12 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar12 = paVar9;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar12 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          paVar9 = paVar12;
        }
        aVar10.value = ((ulong)(uVar6 != 0) | (long)params << 0x20) + 0x200000000;
        paVar9->value = (unsigned_long)aVar10;
        *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
        goto LAB_001fd890;
      }
      if (*(uint *)paVar9 == (uint)(uVar6 != 0)) {
        uVar13 = (ulong)(uVar1 - 2);
        lVar5 = *(long *)(table.size_ + 8 + uVar13 * 0x18);
        if ((lVar5 == lVar4) &&
           (iVar8 = bcmp(*(void **)(table.size_ + uVar13 * 0x18),__s2,lVar5 - 1), iVar8 == 0)) {
          *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar13;
          aVar10 = extraout_RDX;
LAB_001fd890:
          MVar14.ptr.field_1.value = aVar10.value;
          MVar14.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar14.ptr;
        }
      }
    }
    sVar11 = (ulong)uVar7 + 1;
    uVar7 = (uint)sVar11;
    if (sVar11 == sVar3) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }